

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O2

int fe_parse_general_params(cmd_ln_t *config,fe_t *fe)

{
  uint8 uVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  ps_config_t *ppVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  double dVar12;
  
  ppVar5 = ps_config_retain(config);
  fe->config = ppVar5;
  lVar6 = ps_config_int(config,"samprate");
  fe->sampling_rate = (float32)(float)lVar6;
  uVar7 = ps_config_int(config,"frate");
  iVar4 = (int)uVar7;
  if (((0x7fff < iVar4) || (iVar4 < 1)) || ((float)fe->sampling_rate < (float)iVar4)) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
            ,0x44,"Frame rate %d can not be bigger than sample rate %.02f\n",
            (double)(float)fe->sampling_rate,uVar7 & 0xffffffff);
    return -1;
  }
  fe->frame_rate = (int16)uVar7;
  iVar3 = ps_config_bool(config,"dither");
  if (iVar3 != 0) {
    fe->dither = '\x01';
    lVar6 = ps_config_int(config,"seed");
    fe->dither_seed = (int32)lVar6;
  }
  pcVar8 = ps_config_str(config,"input_endian");
  iVar3 = strcmp("little",pcVar8);
  fe->swap = (uint8)iVar3;
  dVar12 = ps_config_float(config,"wlen");
  fe->window_length = (float32)(float)dVar12;
  dVar12 = ps_config_float(config,"alpha");
  fe->pre_emphasis_alpha = (float32)(float)dVar12;
  lVar6 = ps_config_int(config,"ncep");
  fe->num_cepstra = (uint8)lVar6;
  lVar6 = ps_config_int(config,"nfft");
  fe->fft_size = (int16)lVar6;
  uVar10 = (uint)((float)fe->window_length * (float)fe->sampling_rate);
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
          ,0x5c,"Frames are %d samples at intervals of %d\n",(ulong)uVar10,
          (ulong)(uint)(int)((float)fe->sampling_rate / (float)iVar4));
  if (0x7fff < (int)uVar10) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
            ,0x60,"Frame size exceeds maximum FFT size (%d > %d)\n",(ulong)uVar10,0x7fff);
    return -1;
  }
  uVar11 = (uint)fe->fft_size;
  if (uVar11 == 0) {
    fe->fft_order = '\0';
    uVar1 = '\x01';
    for (sVar2 = 1; (int)sVar2 < (int)uVar10; sVar2 = sVar2 * 2) {
      fe->fft_order = uVar1;
      uVar1 = uVar1 + '\x01';
    }
    fe->fft_size = sVar2;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
            ,0x6c,"FFT size automatically set to %d\n");
  }
  else {
    uVar1 = '\0';
    for (uVar9 = uVar11; 1 < (int)uVar9; uVar9 = uVar9 >> 1) {
      if ((fe->fft_size < 1) || ((uVar9 & 1) != 0)) {
        fe->fft_order = uVar1;
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                ,0x73,"fft: number of points must be a power of 2 (is %d)\n");
        return -1;
      }
      uVar1 = uVar1 + '\x01';
    }
    fe->fft_order = uVar1;
    if ((int)uVar11 < (int)uVar10) {
      pcVar8 = "FFT: Number of points must be greater or equal to frame size\n";
      lVar6 = 0x7a;
      goto LAB_00122926;
    }
  }
  iVar4 = ps_config_bool(config,"remove_dc");
  fe->remove_dc = (uint8)iVar4;
  pcVar8 = ps_config_str(config,"transform");
  iVar4 = strcmp(pcVar8,"dct");
  if (iVar4 == 0) {
    uVar1 = '\x01';
  }
  else {
    pcVar8 = ps_config_str(config,"transform");
    iVar4 = strcmp(pcVar8,"legacy");
    if (iVar4 == 0) {
      uVar1 = '\0';
    }
    else {
      pcVar8 = ps_config_str(config,"transform");
      iVar4 = strcmp(pcVar8,"htk");
      if (iVar4 != 0) {
        pcVar8 = "Invalid transform type (values are \'dct\', \'legacy\', \'htk\')\n";
        lVar6 = 0x88;
LAB_00122926:
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_interface.c"
                ,lVar6,pcVar8);
        return -1;
      }
      uVar1 = '\x02';
    }
  }
  fe->transform = uVar1;
  iVar4 = ps_config_bool(config,"logspec");
  if (iVar4 != 0) {
    fe->log_spec = '\x01';
  }
  iVar4 = ps_config_bool(config,"smoothspec");
  if (iVar4 != 0) {
    fe->log_spec = '\x02';
    return 0;
  }
  return 0;
}

Assistant:

int
fe_parse_general_params(cmd_ln_t *config, fe_t * fe)
{
    int j, frate, window_samples;

    fe->config = ps_config_retain(config);
    fe->sampling_rate = ps_config_int(config, "samprate");
    frate = ps_config_int(config, "frate");
    if (frate > MAX_INT16 || frate > fe->sampling_rate || frate < 1) {
        E_ERROR
            ("Frame rate %d can not be bigger than sample rate %.02f\n",
             frate, fe->sampling_rate);
        return -1;
    }

    fe->frame_rate = (int16)frate;
    if (ps_config_bool(config, "dither")) {
        fe->dither = 1;
        fe->dither_seed = ps_config_int(config, "seed");
    }
#ifdef WORDS_BIGENDIAN
    /* i.e. if input_endian is *not* "big", then fe->swap is true. */
    fe->swap = strcmp("big", ps_config_str(config, "input_endian"));
#else        
    /* and vice versa */
    fe->swap = strcmp("little", ps_config_str(config, "input_endian"));
#endif
    fe->window_length = ps_config_float(config, "wlen");
    fe->pre_emphasis_alpha = ps_config_float(config, "alpha");

    fe->num_cepstra = (uint8)ps_config_int(config, "ncep");
    fe->fft_size = (int16)ps_config_int(config, "nfft");

    window_samples = (int)(fe->window_length * fe->sampling_rate);
    E_INFO("Frames are %d samples at intervals of %d\n",
           window_samples, (int)(fe->sampling_rate / frate));
    if (window_samples > MAX_INT16) {
        /* This is extremely unlikely! */
        E_ERROR("Frame size exceeds maximum FFT size (%d > %d)\n",
                window_samples, MAX_INT16);
        return -1;
    }

    /* Set FFT size automatically from window size. */
    if (fe->fft_size == 0) {
        fe->fft_order = 0;
        fe->fft_size = (1<<fe->fft_order);
        while (fe->fft_size < window_samples) {
            fe->fft_order++;
            fe->fft_size <<= 1;
        }
        E_INFO("FFT size automatically set to %d\n", fe->fft_size);
    }
    else {
        /* Check FFT size, compute FFT order (log_2(n)) */
        for (j = fe->fft_size, fe->fft_order = 0; j > 1; j >>= 1, fe->fft_order++) {
            if (((j % 2) != 0) || (fe->fft_size <= 0)) {
                E_ERROR("fft: number of points must be a power of 2 (is %d)\n",
                        fe->fft_size);
                return -1;
            }
        }
        /* Verify that FFT size is greater or equal to window length. */
        if (fe->fft_size < window_samples) {
            E_ERROR("FFT: Number of points must be greater or "
                    "equal to frame size\n");
            return -1;
        }
    }

    fe->remove_dc = ps_config_bool(config, "remove_dc");

    if (0 == strcmp(ps_config_str(config, "transform"), "dct"))
        fe->transform = DCT_II;
    else if (0 == strcmp(ps_config_str(config, "transform"), "legacy"))
        fe->transform = LEGACY_DCT;
    else if (0 == strcmp(ps_config_str(config, "transform"), "htk"))
        fe->transform = DCT_HTK;
    else {
        E_ERROR("Invalid transform type (values are 'dct', 'legacy', 'htk')\n");
        return -1;
    }

    if (ps_config_bool(config, "logspec"))
        fe->log_spec = RAW_LOG_SPEC;
    if (ps_config_bool(config, "smoothspec"))
        fe->log_spec = SMOOTH_LOG_SPEC;

    return 0;
}